

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printNodes(PrinterStream *this)

{
  bool bVar1;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *this_00;
  reference ppVar2;
  CodePrinter *pCVar3;
  ProcessorInstance *pPVar4;
  string local_80;
  string local_60;
  pool_ref<soul::heart::ProcessorInstance> local_30;
  pool_ref<soul::heart::ProcessorInstance> mi;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range2;
  PrinterStream *this_local;
  
  this_00 = &this->module->processorInstances;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ::begin(this_00);
  mi.object = (ProcessorInstance *)
              std::
              vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
              ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                                     *)&mi), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
             ::operator*(&__end2);
    local_30.object = ppVar2->object;
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"node ");
    pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
    padded(&local_60,&pPVar4->instanceName,0x10);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_60);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3," = ");
    pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
    choc::text::CodePrinter::operator<<(pCVar3,&pPVar4->sourceName);
    std::__cxx11::string::~string((string *)&local_60);
    pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
    if (1 < pPVar4->arraySize) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out,'[');
      pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,pPVar4->arraySize);
      choc::text::CodePrinter::operator<<(pCVar3,']');
    }
    pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
    bVar1 = ClockMultiplier::hasValue(&pPVar4->clockMultiplier);
    if (bVar1) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out," ");
      pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_30);
      ClockMultiplier::toString_abi_cxx11_(&local_80,&pPVar4->clockMultiplier);
      choc::text::CodePrinter::operator<<(pCVar3,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::operator<<(pCVar3,(NewLine *)&newLine);
    pool_ref<soul::heart::ProcessorInstance>::~pool_ref(&local_30);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printNodes()
        {
            for (auto mi : module.processorInstances)
            {
                out << "node " << padded (mi->instanceName, 16) << " = " << mi->sourceName;

                if (mi->arraySize > 1)
                    out << '[' << mi->arraySize << ']';

                if (mi->clockMultiplier.hasValue())
                    out << " " << mi->clockMultiplier.toString();

                out << ';' << newLine;
            }
        }